

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::integer_to_string<unsigned_int>
                   (char_t *begin,char_t *end,uint value,bool negative)

{
  char_t *pcVar1;
  uint local_28;
  uint rest;
  char_t *result;
  bool negative_local;
  uint value_local;
  char_t *end_local;
  char_t *begin_local;
  
  local_28 = value;
  if (negative) {
    local_28 = -value;
  }
  rest = local_28;
  result = end + -1;
  do {
    pcVar1 = result + -1;
    *result = (char)((ulong)rest % 10) + '0';
    rest = rest / 10;
    result = pcVar1;
  } while (rest != 0);
  *pcVar1 = '-';
  return pcVar1 + (int)(uint)((negative ^ 0xffU) & 1);
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW char_t* integer_to_string(char_t* begin, char_t* end, U value, bool negative)
	{
		char_t* result = end - 1;
		U rest = negative ? 0 - value : value;

		do
		{
			*result-- = static_cast<char_t>('0' + (rest % 10));
			rest /= 10;
		}
		while (rest);

		assert(result >= begin);
		(void)begin;

		*result = '-';

		return result + !negative;
	}